

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O1

wchar_t wc_to_mb(wchar_t codepage,wchar_t flags,wchar_t *wcstr,wchar_t wclen,char *mbstr,
                wchar_t mblen,char *defchr)

{
  bool bVar1;
  size_t __n;
  wchar_t wVar2;
  wchar_t wVar3;
  long lVar4;
  wchar_t wclen_local;
  wchar_t *local_58;
  mbstate_t state;
  char output [16];
  
  wclen_local = wclen;
  local_58 = wcstr;
  if (codepage == L'\xffff') {
    state.__count = L'\0';
    state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
    wVar2 = L'\0';
    do {
      if (wclen_local < L'\x01') {
        return wVar2;
      }
      __n = wcrtomb(output,*local_58,(mbstate_t *)&state);
      if ((__n == 0xffffffffffffffff) || ((ulong)(long)(wVar2 - mblen) < __n)) {
        bVar1 = false;
      }
      else {
        memcpy(mbstr + wVar2,output,__n);
        local_58 = local_58 + 1;
        wclen_local = wclen_local + L'\xffffffff';
        wVar2 = (int)__n + wVar2;
        bVar1 = true;
      }
    } while (bVar1);
  }
  else if (codepage == L'\0') {
    wVar2 = L'\0';
    if (L'\0' < mblen && L'\0' < wclen) {
      wVar2 = L'\0';
      do {
        wVar3 = *wcstr;
        if ((wVar3 & 0xffffff00U) == 0xd800) {
LAB_0010675f:
          lVar4 = (long)wVar2;
          wVar2 = wVar2 + L'\x01';
          mbstr[lVar4] = (char)wVar3;
        }
        else if (defchr != (char *)0x0) {
          wVar3 = (wchar_t)(byte)*defchr;
          goto LAB_0010675f;
        }
        wcstr = wcstr + 1;
      } while ((L'\x01' < wclen) && (wclen = wclen + L'\xffffffff', wVar2 < mblen));
    }
  }
  else {
    wVar2 = charset_from_unicode
                      (&local_58,&wclen_local,mbstr,mblen,codepage,(charset_state *)0x0,defchr,
                       (uint)(defchr != (char *)0x0));
  }
  return wVar2;
}

Assistant:

int wc_to_mb(int codepage, int flags, const wchar_t *wcstr, int wclen,
             char *mbstr, int mblen, const char *defchr)
{
    if (codepage == DEFAULT_CODEPAGE) {
        char output[MB_LEN_MAX];
        mbstate_t state;
        int n = 0;

        memset(&state, 0, sizeof state);

        while (wclen > 0) {
            size_t i = wcrtomb(output, wcstr[0], &state);
            if (i == (size_t)-1 || i > n - mblen)
                break;
            memcpy(mbstr+n, output, i);
            n += i;
            wcstr++;
            wclen--;
        }

        return n;
    } else if (codepage == CS_NONE) {
        int n = 0;
        while (wclen > 0 && n < mblen) {
            if (*wcstr >= 0xD800 && *wcstr < 0xD900)
                mbstr[n++] = (*wcstr & 0xFF);
            else if (defchr)
                mbstr[n++] = *defchr;
            wcstr++;
            wclen--;
        }
        return n;
    } else {
        return charset_from_unicode(&wcstr, &wclen, mbstr, mblen, codepage,
                                    NULL, defchr?defchr:NULL, defchr?1:0);
    }
}